

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O2

bool read_gt_data(string *filename,vector<ground_truth,_std::allocator<ground_truth>_> *gt)

{
  uint uVar1;
  istream *piVar2;
  double azimuth;
  double y;
  double x;
  ground_truth single_gt;
  string line_pos;
  ifstream in_file_pos;
  uint auStack_398 [122];
  istringstream iss_pos;
  
  std::ifstream::ifstream(&in_file_pos,(filename->_M_dataplus)._M_p,_S_in);
  uVar1 = *(uint *)((long)auStack_398 + *(long *)(_in_file_pos + -0x18));
  if ((uVar1 & 5) == 0) {
    line_pos._M_dataplus._M_p = (pointer)&line_pos.field_2;
    line_pos._M_string_length = 0;
    line_pos.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&in_file_pos,(string *)&line_pos);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&iss_pos,(string *)&line_pos,_S_in);
      std::istream::_M_extract<double>((double *)&iss_pos);
      std::istream::_M_extract<double>((double *)&iss_pos);
      std::istream::_M_extract<double>((double *)&iss_pos);
      std::vector<ground_truth,_std::allocator<ground_truth>_>::push_back(gt,&single_gt);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss_pos);
    }
    std::__cxx11::string::~string((string *)&line_pos);
  }
  std::ifstream::~ifstream(&in_file_pos);
  return (uVar1 & 5) == 0;
}

Assistant:

inline bool read_gt_data(std::string filename, std::vector<ground_truth>& gt) 
{
	// Get file of position measurements:
	std::ifstream in_file_pos(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_pos) {
		return false;
	}

	// Declare single line of position measurement file:
	std::string line_pos;

	// Run over each single line:
	while(getline(in_file_pos, line_pos)){

		std::istringstream iss_pos(line_pos);

		// Declare position values:
		double x, y, azimuth;

		// Declare single ground truth:
		ground_truth single_gt; 

		//read data from line to values:
		iss_pos >> x;
		iss_pos >> y;
		iss_pos >> azimuth;

		// Set values
		single_gt.x = x;
		single_gt.y = y;
		single_gt.theta = azimuth;

		// Add to list of control measurements and ground truth:
		gt.push_back(single_gt);
	}
	return true;
}